

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::StreamingConcatenationExpression::serializeTo
          (StreamingConcatenationExpression *this,ASTSerializer *serializer)

{
  long lVar1;
  StreamExpression *stream;
  pointer pSVar2;
  string_view name;
  
  ASTSerializer::write(serializer,9,"sliceSize",this->sliceSize);
  if ((this->streams_)._M_extent._M_extent_value != 0) {
    name._M_str = "streams";
    name._M_len = 7;
    ASTSerializer::startArray(serializer,name);
    pSVar2 = (this->streams_)._M_ptr;
    for (lVar1 = (this->streams_)._M_extent._M_extent_value * 0x18; lVar1 != 0;
        lVar1 = lVar1 + -0x18) {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,7,"operand",(size_t)(pSVar2->operand).ptr);
      if (pSVar2->withExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,8,"withExpr",(size_t)pSVar2->withExpr);
      }
      ASTSerializer::endObject(serializer);
      pSVar2 = pSVar2 + 1;
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void StreamingConcatenationExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("sliceSize", sliceSize);
    if (!streams().empty()) {
        serializer.startArray("streams");
        for (auto& stream : streams()) {
            serializer.startObject();
            serializer.write("operand", *stream.operand);
            if (stream.withExpr)
                serializer.write("withExpr", *stream.withExpr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}